

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O2

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Index IVar9;
  invalid_argument *this_00;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  puVar3 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (ulong)columnIndex1 * 0x30;
  lVar11 = (ulong)columnIndex2 * 0x30;
  uVar1 = puVar3[*(uint *)(lVar4 + 4 + lVar10)];
  uVar2 = puVar3[*(uint *)(lVar4 + 4 + lVar11)];
  iVar8 = uVar1 - uVar2;
  if (uVar1 < uVar2) {
    iVar8 = -(uVar1 - uVar2);
  }
  if (iVar8 == 1) {
    bVar5 = _is_negative_in_pair(this,columnIndex1);
    bVar6 = _is_negative_in_pair(this,columnIndex2);
    bVar7 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::is_zero_entry((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                             *)this,columnIndex2,
                            *(ID_index *)
                             ((long)this[1].super_type.
                                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                                    .barcode_.
                                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4 + lVar10));
    if (bVar5 && bVar6) {
      if (!bVar7) {
        IVar9 = _negative_vine_swap(this,columnIndex1,columnIndex2);
        return IVar9;
      }
      lVar4 = (long)this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                    .barcode_.
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(lVar4 + 4 + lVar10);
      uVar13 = (ulong)uVar1;
      uVar2 = *(uint *)(lVar4 + 4 + lVar11);
      uVar12 = (ulong)uVar2;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::negative_transpose(&this->super_type,uVar1,uVar2);
    }
    else if (bVar5) {
      if (!bVar7) {
        IVar9 = _negative_positive_vine_swap(this,columnIndex1,columnIndex2);
        return IVar9;
      }
      lVar4 = (long)this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                    .barcode_.
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(lVar4 + 4 + lVar10);
      uVar13 = (ulong)uVar1;
      uVar2 = *(uint *)(lVar4 + 4 + lVar11);
      uVar12 = (ulong)uVar2;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::negative_positive_transpose(&this->super_type,uVar1,uVar2);
    }
    else if (bVar6) {
      if (!bVar7) {
        IVar9 = _positive_negative_vine_swap(this,columnIndex1,columnIndex2);
        return IVar9;
      }
      lVar4 = (long)this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                    .barcode_.
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(lVar4 + 4 + lVar10);
      uVar13 = (ulong)uVar1;
      uVar2 = *(uint *)(lVar4 + 4 + lVar11);
      uVar12 = (ulong)uVar2;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_negative_transpose(&this->super_type,uVar1,uVar2);
    }
    else {
      if (!bVar7) {
        IVar9 = _positive_vine_swap(this,columnIndex1,columnIndex2);
        return IVar9;
      }
      lVar4 = (long)this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                    .barcode_.
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(lVar4 + 4 + lVar10);
      uVar13 = (ulong)uVar1;
      uVar2 = *(uint *)(lVar4 + 4 + lVar11);
      uVar12 = (ulong)uVar2;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_transpose(&this->super_type,uVar1,uVar2);
    }
    puVar3 = (this->super_type).pivotToPosition_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = puVar3[uVar13];
    puVar3[uVar13] = puVar3[uVar12];
    puVar3[uVar12] = uVar1;
    return columnIndex1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,
             "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the \'real\' matrix."
            );
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}